

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams_tests.cpp
# Opt level: O0

void __thiscall
streams_tests::streams_vector_reader_rvalue::test_method(streams_vector_reader_rvalue *this)

{
  long lVar1;
  Span<const_unsigned_char> data_00;
  initializer_list<unsigned_char> __l;
  bool bVar2;
  long in_FS_OFFSET;
  uint32_t varint;
  SpanReader reader;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  char *in_stack_fffffffffffffe38;
  undefined7 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe47;
  char *in_stack_fffffffffffffe48;
  undefined7 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe67;
  lazy_ostream *in_stack_fffffffffffffe68;
  undefined7 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe77;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffe78;
  unit_test_log_t *this_00;
  undefined7 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe87;
  size_type in_stack_fffffffffffffe88;
  const_string local_130 [2];
  lazy_ostream local_110 [2];
  assertion_result local_f0 [2];
  undefined4 local_54 [9];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffffe38);
  __l._M_array._7_1_ = in_stack_fffffffffffffe87;
  __l._M_array._0_7_ = in_stack_fffffffffffffe80;
  __l._M_len = in_stack_fffffffffffffe88;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_fffffffffffffe78,__l,
             (allocator_type *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffffe38);
  Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((Span<const_unsigned_char> *)in_stack_fffffffffffffe48,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),in_stack_fffffffffffffe38
            );
  data_00.m_data._7_1_ = in_stack_fffffffffffffe47;
  data_00.m_data._0_7_ = in_stack_fffffffffffffe40;
  data_00.m_size = (size_t)in_stack_fffffffffffffe48;
  SpanReader::SpanReader((SpanReader *)in_stack_fffffffffffffe38,data_00);
  local_54[0] = 0;
  Using<VarIntFormatter<(VarIntMode)0>,unsigned_int&>
            ((uint *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
  SpanReader::operator>>
            ((SpanReader *)in_stack_fffffffffffffe48,
             (Wrapper<VarIntFormatter<(VarIntMode)0>,_unsigned_int_&> *)
             CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe48,
               (pointer)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
               (unsigned_long)in_stack_fffffffffffffe38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffe78,
               (const_string *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
               (size_t)in_stack_fffffffffffffe68,
               (const_string *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
               (char (*) [1])in_stack_fffffffffffffe38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe48,
               (pointer)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
               (unsigned_long)in_stack_fffffffffffffe38);
    in_stack_fffffffffffffe48 = "54321U";
    in_stack_fffffffffffffe40 = SUB87(&stack0xffffffffffffff4c,0);
    in_stack_fffffffffffffe47 = (undefined1)((ulong)&stack0xffffffffffffff4c >> 0x38);
    in_stack_fffffffffffffe38 = "varint";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (&stack0xffffffffffffff60,&stack0xffffffffffffff50,0xb6,1,2,local_54);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffe38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    this_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe48,
               (pointer)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
               (unsigned_long)in_stack_fffffffffffffe38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_00,(const_string *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70)
               ,(size_t)in_stack_fffffffffffffe68,
               (const_string *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
    in_stack_fffffffffffffe77 = SpanReader::empty((SpanReader *)in_stack_fffffffffffffe38);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffffe48,(bool)in_stack_fffffffffffffe47);
    in_stack_fffffffffffffe68 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe48,
               (pointer)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
               (unsigned_long)in_stack_fffffffffffffe38);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
               (basic_cstring<const_char> *)in_stack_fffffffffffffe38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe48,
               (pointer)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
               (unsigned_long)in_stack_fffffffffffffe38);
    in_stack_fffffffffffffe38 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_f0,local_110,local_130,0xb7,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffffe38);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffe38);
    in_stack_fffffffffffffe67 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffe67);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe48);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(streams_vector_reader_rvalue)
{
    std::vector<uint8_t> data{0x82, 0xa7, 0x31};
    SpanReader reader{data};
    uint32_t varint = 0;
    // Deserialize into r-value
    reader >> VARINT(varint);
    BOOST_CHECK_EQUAL(varint, 54321U);
    BOOST_CHECK(reader.empty());
}